

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O3

bool __thiscall Json::StyledStreamWriter::isMultineArray(StyledStreamWriter *this,Value *value)

{
  byte bVar1;
  bool bVar2;
  ArrayIndex AVar3;
  ArrayIndex AVar4;
  Value *pVVar5;
  StyledStreamWriter *this_00;
  long lVar6;
  byte bVar7;
  uint uVar8;
  ulong uVar9;
  bool bVar10;
  
  AVar3 = Value::size(value);
  bVar10 = this->rightMargin_ <= AVar3 * 3;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(&this->childValues_,
                    (this->childValues_).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  if (AVar3 != 0 && !bVar10) {
    uVar8 = 1;
    do {
      pVVar5 = Value::operator[](value,uVar8 - 1);
      bVar10 = Value::isArray(pVVar5);
      if (bVar10) {
LAB_0051b758:
        AVar4 = Value::size(pVVar5);
        bVar10 = AVar4 != 0;
      }
      else {
        bVar10 = Value::isObject(pVVar5);
        if (bVar10) goto LAB_0051b758;
        bVar10 = false;
      }
    } while ((uVar8 < AVar3) && (uVar8 = uVar8 + 1, !bVar10));
  }
  bVar2 = true;
  if (!bVar10) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::reserve(&this->childValues_,(ulong)AVar3);
    bVar1 = this->field_0x68 | 1;
    this->field_0x68 = bVar1;
    uVar8 = AVar3 * 2 + 2;
    if (AVar3 == 0) {
      bVar7 = 0;
    }
    else {
      lVar6 = 8;
      uVar9 = 0;
      bVar7 = 0;
      do {
        this_00 = (StyledStreamWriter *)value;
        pVVar5 = Value::operator[](value,(ArrayIndex)uVar9);
        bVar10 = hasCommentForValue(this_00,pVVar5);
        bVar7 = bVar7 | bVar10;
        pVVar5 = Value::operator[](value,(ArrayIndex)uVar9);
        writeValue(this,pVVar5);
        uVar8 = uVar8 + *(int *)((long)&(((this->childValues_).
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                        _M_p + lVar6);
        uVar9 = uVar9 + 1;
        lVar6 = lVar6 + 0x20;
      } while (AVar3 != uVar9);
      bVar1 = this->field_0x68;
    }
    this->field_0x68 = bVar1 & 0xfe;
    bVar2 = (bool)(this->rightMargin_ <= uVar8 | bVar7);
  }
  return bVar2;
}

Assistant:

bool StyledStreamWriter::isMultineArray(const Value& value) {
  ArrayIndex const size = value.size();
  bool isMultiLine = size * 3 >= rightMargin_;
  childValues_.clear();
  for (ArrayIndex index = 0; index < size && !isMultiLine; ++index) {
    const Value& childValue = value[index];
    isMultiLine = ((childValue.isArray() || childValue.isObject()) &&
                        childValue.size() > 0);
  }
  if (!isMultiLine) // check if line length > max line length
  {
    childValues_.reserve(size);
    addChildValues_ = true;
    ArrayIndex lineLength = 4 + (size - 1) * 2; // '[ ' + ', '*n + ' ]'
    for (ArrayIndex index = 0; index < size; ++index) {
      if (hasCommentForValue(value[index])) {
        isMultiLine = true;
      }
      writeValue(value[index]);
      lineLength += static_cast<ArrayIndex>(childValues_[index].length());
    }
    addChildValues_ = false;
    isMultiLine = isMultiLine || lineLength >= rightMargin_;
  }
  return isMultiLine;
}